

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tap.c
# Opt level: O3

int is_at_loc(char *file,int line,char *got,char *expected,char *fmt,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_R9;
  bool bVar2;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  __va_list_tag local_108;
  undefined1 local_e8 [40];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_c0 = in_R9;
  if (got == expected) {
    bVar2 = true;
  }
  else if (expected == (char *)0x0 || got == (char *)0x0) {
    bVar2 = false;
  }
  else {
    iVar1 = strcmp(got,expected);
    bVar2 = iVar1 == 0;
  }
  local_108.reg_save_area = local_e8;
  local_108.overflow_arg_area = &args[0].overflow_arg_area;
  local_108.gp_offset = 0x28;
  local_108.fp_offset = 0x30;
  vok_at_loc(file,line,(uint)bVar2,fmt,&local_108);
  if (bVar2 == false) {
    diag("         got: \'%s\'",got);
    diag("    expected: \'%s\'",expected);
  }
  return (uint)bVar2;
}

Assistant:

int
is_at_loc (const char *file, int line, const char *got, const char *expected,
           const char *fmt, ...)
{
    int test = eq(got, expected);
    va_list args;
    va_start(args, fmt);
    vok_at_loc(file, line, test, fmt, args);
    va_end(args);
    if (!test) {
        diag("         got: '%s'", got);
        diag("    expected: '%s'", expected);
    }
    return test;
}